

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

void __thiscall slang::ast::TypePrinter::appendMembers(TypePrinter *this,Scope *scope)

{
  bool bVar1;
  pointer pFVar2;
  Type *type;
  size_t sVar3;
  string_view local_a8;
  basic_string_view<char> local_98;
  VariableSymbol *local_88;
  VariableSymbol *var;
  Symbol *member;
  iterator __end2;
  iterator __begin2;
  iterator_range<slang::ast::Scope::iterator> *__range2;
  Scope *local_40;
  Scope *scope_local;
  TypePrinter *this_local;
  basic_string_view<char> *local_28;
  char *local_20;
  basic_string_view<char> *local_18;
  TypePrinter *local_10;
  
  local_40 = scope;
  scope_local = (Scope *)this;
  pFVar2 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
           operator->(&this->buffer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&__range2,"{");
  FormatBuffer::append(pFVar2,___range2);
  ___begin2 = Scope::members(local_40);
  __end2 = iterator_range<slang::ast::Scope::iterator>::begin
                     ((iterator_range<slang::ast::Scope::iterator> *)&__begin2);
  member = (Symbol *)
           iterator_range<slang::ast::Scope::iterator>::end
                     ((iterator_range<slang::ast::Scope::iterator> *)&__begin2);
  while( true ) {
    bVar1 = iterator_facade<slang::ast::Scope::iterator,_std::forward_iterator_tag,_const_slang::ast::Symbol,_long,_const_slang::ast::Symbol_*,_const_slang::ast::Symbol_&>
            ::operator!=((iterator_facade<slang::ast::Scope::iterator,_std::forward_iterator_tag,_const_slang::ast::Symbol,_long,_const_slang::ast::Symbol_*,_const_slang::ast::Symbol_&>
                          *)&__end2,(iterator *)&member);
    if (!bVar1) break;
    var = (VariableSymbol *)Scope::iterator::operator*(&__end2);
    local_88 = Symbol::as<slang::ast::VariableSymbol>((Symbol *)var);
    type = ValueSymbol::getType(&local_88->super_ValueSymbol);
    append(this,type);
    pFVar2 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
             operator->(&this->buffer);
    local_28 = &local_98;
    this_local = (TypePrinter *)anon_var_dwarf_ed7663;
    local_20 = " {};";
    local_18 = local_28;
    sVar3 = std::char_traits<char>::length(" {};");
    local_98.size_ = sVar3;
    local_10 = this_local;
    FormatBuffer::format<std::basic_string_view<char,std::char_traits<char>>const&>
              (pFVar2,(format_string<const_std::basic_string_view<char>_&>)local_98,
               &(local_88->super_ValueSymbol).super_Symbol.name);
    Scope::iterator::operator++(&__end2);
  }
  pFVar2 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
           operator->(&this->buffer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"}");
  FormatBuffer::append(pFVar2,local_a8);
  return;
}

Assistant:

void TypePrinter::appendMembers(const Scope& scope) {
    buffer->append("{");
    for (auto& member : scope.members()) {
        auto& var = member.as<VariableSymbol>();
        append(var.getType());
        buffer->format(" {};", var.name);
    }
    buffer->append("}");
}